

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix4.h
# Opt level: O2

vector3d<float> __thiscall
irr::core::CMatrix4<float>::getRotationDegrees(CMatrix4<float> *this,vector3d<float> *scale_)

{
  float fVar1;
  undefined1 auVar2 [16];
  ulong uVar3;
  double dVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  undefined1 auVar10 [16];
  double dVar11;
  vector3d<float> vVar12;
  
  dVar11 = 2.938736052218037e-39;
  dVar9 = 2.938736052218037e-39;
  if (1e-06 < ABS(scale_->X)) {
    dVar9 = 1.0 / (double)scale_->X;
  }
  if (1e-06 < ABS(scale_->Y)) {
    dVar11 = 1.0 / (double)scale_->Y;
  }
  fVar1 = scale_->Z;
  dVar4 = (double)this->M[2] * dVar9;
  dVar8 = -1.0;
  if (-1.0 <= dVar4) {
    dVar8 = dVar4;
  }
  if (1.0 <= dVar8) {
    dVar8 = 1.0;
  }
  dVar4 = asin(dVar8);
  dVar8 = cos(dVar4);
  if (ABS((float)dVar8) <= 1e-06) {
    dVar9 = atan2((double)-this->M[4] * dVar11,(double)this->M[5] * dVar11);
    uVar5 = SUB84(dVar9,0);
    uVar6 = (undefined4)((ulong)dVar9 >> 0x20);
    dVar11 = 0.0;
  }
  else {
    if (ABS(fVar1) <= 1e-06) {
      dVar7 = 2.938736052218037e-39;
    }
    else {
      dVar7 = 1.0 / (double)fVar1;
    }
    dVar8 = 1.0 / dVar8;
    dVar11 = atan2(dVar11 * (double)this->M[6] * dVar8,(double)this->M[10] * dVar8 * dVar7);
    dVar11 = dVar11 * 57.29577951308232;
    dVar9 = atan2((double)this->M[1] * dVar8 * dVar9,(double)this->M[0] * dVar8 * dVar9);
    uVar5 = SUB84(dVar9,0);
    uVar6 = (undefined4)((ulong)dVar9 >> 0x20);
  }
  dVar4 = dVar4 * -57.29577951308232;
  dVar9 = (double)CONCAT44(uVar6,uVar5) * 57.29577951308232;
  uVar3 = ~-(ulong)(dVar4 < 0.0) & (ulong)dVar4;
  auVar10._0_8_ = (ulong)(dVar11 + 360.0) & -(ulong)(dVar11 < 0.0);
  auVar10._8_8_ = (ulong)(dVar4 + 360.0) & -(ulong)(dVar4 < 0.0);
  auVar2._8_4_ = (int)uVar3;
  auVar2._0_8_ = ~-(ulong)(dVar11 < 0.0) & (ulong)dVar11;
  auVar2._12_4_ = (int)(uVar3 >> 0x20);
  vVar12.X = (float)SUB168(auVar10 | auVar2,0);
  vVar12.Y = (float)SUB168(auVar10 | auVar2,8);
  vVar12.Z = (float)(double)(~-(ulong)(dVar9 < 0.0) & (ulong)dVar9 |
                            (ulong)(dVar9 + 360.0) & -(ulong)(dVar9 < 0.0));
  return vVar12;
}

Assistant:

inline core::vector3d<T> CMatrix4<T>::getRotationDegrees(const vector3d<T> &scale_) const
{
	const CMatrix4<T> &mat = *this;
	const core::vector3d<f64> scale(core::iszero(scale_.X) ? FLT_MAX : scale_.X, core::iszero(scale_.Y) ? FLT_MAX : scale_.Y, core::iszero(scale_.Z) ? FLT_MAX : scale_.Z);
	const core::vector3d<f64> invScale(core::reciprocal(scale.X), core::reciprocal(scale.Y), core::reciprocal(scale.Z));

	f64 Y = -asin(core::clamp(mat[2] * invScale.X, -1.0, 1.0));
	const f64 C = cos(Y);
	Y *= RADTODEG64;

	f64 rotx, roty, X, Z;

	if (!core::iszero((T)C)) {
		const f64 invC = core::reciprocal(C);
		rotx = mat[10] * invC * invScale.Z;
		roty = mat[6] * invC * invScale.Y;
		X = atan2(roty, rotx) * RADTODEG64;
		rotx = mat[0] * invC * invScale.X;
		roty = mat[1] * invC * invScale.X;
		Z = atan2(roty, rotx) * RADTODEG64;
	} else {
		X = 0.0;
		rotx = mat[5] * invScale.Y;
		roty = -mat[4] * invScale.Y;
		Z = atan2(roty, rotx) * RADTODEG64;
	}

	// fix values that get below zero
	if (X < 0.0)
		X += 360.0;
	if (Y < 0.0)
		Y += 360.0;
	if (Z < 0.0)
		Z += 360.0;

	return vector3d<T>((T)X, (T)Y, (T)Z);
}